

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O1

optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
* __thiscall
tinyusdz::crate::CrateValue::
get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
          (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
           *__return_storage_ptr__,CrateValue *this)

{
  _Base_ptr p_Var1;
  undefined1 *puVar2;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  *psVar3;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_48;
  
  tinyusdz::value::Value::
  get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
            (&local_48,&this->value_,false);
  __return_storage_ptr__->has_value_ = local_48.has_value_;
  if (local_48.has_value_ == true) {
    p_Var1 = (_Base_ptr)((long)&__return_storage_ptr__->contained + 8);
    if ((_Link_type)local_48.contained._16_8_ == (_Link_type)0x0) {
      *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(_Base_ptr *)((long)&__return_storage_ptr__->contained + 0x18) = p_Var1;
      *(_Base_ptr *)((long)&__return_storage_ptr__->contained + 0x20) = p_Var1;
      psVar3 = &__return_storage_ptr__->contained;
    }
    else {
      puVar2 = (undefined1 *)((long)&local_48.contained + 8);
      *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_48.contained._8_4_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_48.contained._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_48.contained._24_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = local_48.contained._32_8_;
      *(_Base_ptr *)(local_48.contained._16_8_ + 8) = p_Var1;
      psVar3 = &local_48.contained;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = local_48.contained._40_8_;
      local_48.contained._16_8_ = (_Link_type)0x0;
      local_48.contained._24_8_ = puVar2;
      local_48.contained._32_8_ = puVar2;
    }
    *(undefined8 *)((long)psVar3 + 0x28) = 0;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)&local_48.contained,(_Link_type)local_48.contained._16_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }